

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alex.h
# Opt level: O3

void __thiscall
alex::Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true>::ConstIterator::
initialize(ConstIterator *this)

{
  uint uVar1;
  data_node_type *pdVar2;
  ulong uVar3;
  ConstIterator CStack_18;
  
  pdVar2 = this->cur_leaf_;
  if (pdVar2 != (data_node_type *)0x0) {
    uVar1 = this->cur_idx_;
    uVar3 = (ulong)uVar1;
    if ((int)uVar1 < 0) {
      __assert_fail("cur_idx_ >= 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]ALEX/src/core/alex.h"
                    ,0xa85,
                    "void alex::Alex<int, int>::ConstIterator::initialize() [T = int, P = int, Compare = alex::AlexCompare, Alloc = std::allocator<std::pair<int, int>>, allow_duplicates = true]"
                   );
    }
    if (pdVar2->data_capacity_ <= (int)uVar1) {
      pdVar2 = pdVar2->next_leaf_;
      uVar3 = 0;
      this->cur_leaf_ = pdVar2;
      this->cur_idx_ = 0;
      if (pdVar2 == (data_node_type *)0x0) {
        return;
      }
    }
    this->cur_bitmap_idx_ = (int)(uVar3 >> 6);
    this->cur_bitmap_data_ = (pdVar2->bitmap_[uVar3 >> 6] >> (uVar3 & 0x3f)) << (uVar3 & 0x3f);
    operator++(&CStack_18,this,0);
  }
  return;
}

Assistant:

void initialize() {
      if (!cur_leaf_) return;
      assert(cur_idx_ >= 0);
      if (cur_idx_ >= cur_leaf_->data_capacity_) {
        cur_leaf_ = cur_leaf_->next_leaf_;
        cur_idx_ = 0;
        if (!cur_leaf_) return;
      }

      cur_bitmap_idx_ = cur_idx_ >> 6;
      cur_bitmap_data_ = cur_leaf_->bitmap_[cur_bitmap_idx_];

      // Zero out extra bits
      int bit_pos = cur_idx_ - (cur_bitmap_idx_ << 6);
      cur_bitmap_data_ &= ~((1ULL << bit_pos) - 1);

      (*this)++;
    }